

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGather2DCase::createInstance
          (TextureGather2DCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize OVar1;
  GatherArgs *__cur;
  VkPhysicalDeviceProperties *pVVar2;
  TextureGatherInstance *this_00;
  Context *pCVar3;
  pointer pGVar4;
  long lVar5;
  TextureFormat *format;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  iterations;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  local_48;
  TextureFormat local_30;
  
  gatherType = (this->m_baseParams).gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  pVVar2 = Context::getDeviceProperties(context);
  if (OVar1 == OFFSETSIZE_NONE) {
    local_30.order = R;
    local_30.type = SNORM_INT8;
  }
  else if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    local_30.order = (pVVar2->limits).minTexelGatherOffset;
    local_30.type = (pVVar2->limits).maxTexelGatherOffset;
  }
  else if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
    local_30.order = ~RGB;
    local_30.type = UNORM_BYTE_44;
  }
  else {
    local_30.order = ~R;
    local_30.type = ~SNORM_INT8;
  }
  generateBasic2DCaseIterations
            (&local_48,gatherType,(TextureFormat *)(ulong)(this->m_baseParams).textureFormat.order,
             (IVec2 *)&local_30);
  this_00 = (TextureGatherInstance *)operator_new(0x2d8);
  TextureGatherInstance::TextureGatherInstance(this_00,context,&this->m_baseParams);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TextureGather2DInstance_00d2d730;
  *(undefined8 *)&this_00->field_0x264 = *(undefined8 *)(this->m_textureSize).m_data;
  *(undefined1 (*) [16])&this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context =
       (undefined1  [16])0x0;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)0x0;
  pCVar3 = (Context *)
           std::
           _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
           ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          *)(((long)local_48.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                            -0x71c71c71c71c71c7),(size_t)context);
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = pCVar3;
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = pCVar3;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)
                (((long)local_48.
                        super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                       ._M_impl.super__Vector_impl_data._M_start) + (long)pCVar3);
  for (pGVar4 = local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pGVar4 != local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish; pGVar4 = pGVar4 + 1) {
    *(int *)&pCVar3->m_testCtx = pGVar4->componentNdx;
    lVar5 = 1;
    do {
      *(int *)((long)pCVar3 + lVar5 * 8 + -4) = pGVar4->offsets[lVar5 + -1].m_data[0];
      *(int *)(&pCVar3->m_testCtx + lVar5) = pGVar4->offsets[lVar5 + -1].m_data[1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    pCVar3 = (Context *)
             &(pCVar3->m_device).
              super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
              field_0xc;
  }
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = pCVar3;
  format = &local_30;
  local_30.order = CHANNELORDER_LAST;
  local_30.type = CHANNELTYPE_LAST;
  tcu::Texture2D::Texture2D
            ((Texture2D *)
             &this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
              super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
              .m_data.field_0x8,format,1,1);
  TextureGatherInstance::init(this_00,(EVP_PKEY_CTX *)format);
  if (local_48.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGather2DCase::createInstance (Context& context) const
{
	const vector<GatherArgs>	iterations	= generateBasic2DCaseIterations(m_baseParams.gatherType,
																			m_baseParams.textureFormat,
																			getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits));

	return new TextureGather2DInstance(context, m_baseParams, m_textureSize, iterations);
}